

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

SN_ELEMENT * __thiscall
ON_SerialNumberMap::RemoveSerialNumberAndId(ON_SerialNumberMap *this,ON__UINT64 sn)

{
  ON__UINT32 OVar1;
  ON__UINT64 OVar2;
  ON__UINT32 OVar3;
  SN_ELEMENT *e;
  ON__UINT64 sn_local;
  ON_SerialNumberMap *this_local;
  
  this_local = (ON_SerialNumberMap *)FindElementHelper(this,sn);
  if ((this_local == (ON_SerialNumberMap *)0x0) ||
     ((ON__UINT8)this_local->m_snblk_list_capacity == '\0')) {
    this_local = (ON_SerialNumberMap *)0x0;
  }
  else {
    Internal_HashTableRemoveElement(this,(SN_ELEMENT *)this_local,true);
    *(ON__UINT8 *)&this_local->m_snblk_list_capacity = '\0';
    this->m_sn_purged = this->m_sn_purged + 1;
    OVar1 = this->m_e_blk->m_count;
    OVar3 = this->m_e_blk->m_purged + 1;
    this->m_e_blk->m_purged = OVar3;
    if (OVar1 == OVar3) {
      if (this->m_e_blk == this->m_sn_block0) {
        this->m_sn_count = this->m_sn_count - (ulong)this->m_sn_block0->m_count;
        this->m_sn_purged = this->m_sn_purged - (ulong)this->m_sn_block0->m_count;
        ON_SN_BLOCK::EmptyBlock(this->m_sn_block0);
      }
      else if (1 < this->m_e_blk->m_count) {
        this->m_sn_count = this->m_sn_count - (ulong)(this->m_e_blk->m_count - 1);
        this->m_sn_purged = this->m_sn_purged - (ulong)(this->m_e_blk->m_count - 1);
        this->m_e_blk->m_count = 1;
        this->m_e_blk->m_purged = 1;
        OVar2 = this->m_e_blk->m_sn[0].m_sn;
        this->m_e_blk->m_sn1 = OVar2;
        this->m_e_blk->m_sn0 = OVar2;
      }
    }
  }
  return (SN_ELEMENT *)this_local;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* 
ON_SerialNumberMap::RemoveSerialNumberAndId(ON__UINT64 sn)
{
  struct SN_ELEMENT* e = FindElementHelper(sn);
  if ( e && e->m_sn_active )
  {
    Internal_HashTableRemoveElement(e,true);

    e->m_sn_active = 0;
    m_sn_purged++;
    if ( m_e_blk->m_count == ++m_e_blk->m_purged )
    {
      // every item in the block is purged
      if ( m_e_blk == &m_sn_block0 )
      {
        // Every element in m_sn_block0 is purged.
        // Empty m_sn_block0.
        m_sn_count -= m_sn_block0.m_count;
        m_sn_purged -= m_sn_block0.m_count;
        m_sn_block0.EmptyBlock();
      }
      else if ( m_e_blk->m_count > 1 )
      {
        // m_e_blk is in m_sn_list[] and every element
        // in m_e_blk is purged. Remove all but
        // except one of these elements.
        // Note: We cannot empty blocks in the m_sn_list[] because
        //       this class has code that assumes the blocks
        //       in m_sn_list[] have m_count >= 1.  This makes
        //       the class generally faster.  There is code in 
        //       FindElementHelper() the keeps the m_sn_list[]
        //       blocks relatively tidy.
        m_sn_count  -= (m_e_blk->m_count-1);
        m_sn_purged -= (m_e_blk->m_count-1);
        m_e_blk->m_count = 1;
        m_e_blk->m_purged = 1;
        m_e_blk->m_sn0 = m_e_blk->m_sn1 = m_e_blk->m_sn[0].m_sn;
      }
    }
    return e;
  }

  return 0;
}